

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::RealDebugCounter::Register(RealDebugCounter *this,string_view name)

{
  undefined8 uVar1;
  bool bVar2;
  Map *this_00;
  mapped_type *this_01;
  vector<google::protobuf::internal::RealDebugCounter_const*,std::allocator<google::protobuf::internal::RealDebugCounter_const*>>
  *this_02;
  int in_R8D;
  string_view text;
  int64_t val;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parts;
  RealDebugCounter *local_60;
  _Variadic_union<long,_std::basic_string_view<char,_std::char_traits<char>_>_> local_58;
  undefined1 local_48;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_40;
  
  local_58._8_8_ = name._M_str;
  local_58._M_first._M_storage = (_Uninitialized<long,_true>)name._M_len;
  local_48 = 0x2e;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,absl::lts_20250127::AllowEmpty,std::basic_string_view<char,std::char_traits<char>>>
  ::
  ConvertToPair<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_40,&local_58);
  text._M_str = (char *)&local_58;
  text._M_len = (size_t)local_40.second._M_str;
  bVar2 = absl::lts_20250127::numbers_internal::safe_strto64_base
                    ((numbers_internal *)local_40.second._M_len,text,(Nonnull<int64_t_*>)0xa,in_R8D)
  ;
  uVar1 = local_58._M_first._M_storage;
  this_00 = CounterMap();
  this_01 = std::
            map<std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>_>_>
            ::operator[](this_00,&local_40.first);
  local_48 = !bVar2;
  local_58._M_first._M_storage = (_Uninitialized<long,_true>)(_Uninitialized<long,_true>)uVar1;
  if ((bool)local_48) {
    local_58._M_first._M_storage =
         (_Uninitialized<long,_true>)(_Uninitialized<long,_true>)local_40.second._M_len;
    local_58._8_8_ = local_40.second._M_str;
  }
  this_02 = (vector<google::protobuf::internal::RealDebugCounter_const*,std::allocator<google::protobuf::internal::RealDebugCounter_const*>>
             *)std::
               map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>
               ::operator[](this_01,(key_type *)&local_58._M_first);
  local_60 = this;
  std::
  vector<google::protobuf::internal::RealDebugCounter_const*,std::allocator<google::protobuf::internal::RealDebugCounter_const*>>
  ::emplace_back<google::protobuf::internal::RealDebugCounter_const*>(this_02,&local_60);
  return;
}

Assistant:

void RealDebugCounter::Register(absl::string_view name) {
  std::pair<absl::string_view, absl::string_view> parts =
      absl::StrSplit(name, '.');
  int64_t as_int;
  if (absl::SimpleAtoi(parts.second, &as_int)) {
    CounterMap()[parts.first][as_int].push_back(this);
  } else {
    CounterMap()[parts.first][parts.second].push_back(this);
  }
}